

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseHelper.cpp
# Opt level: O0

void __thiscall
glslang::TParseContext::typeParametersCheck
          (TParseContext *this,TSourceLoc *loc,TPublicType *publicType)

{
  TBasicType TVar1;
  bool bVar2;
  int iVar3;
  char *pcVar4;
  int local_4c;
  uint local_28;
  uint32_t dim;
  uint32_t numDims;
  int use;
  TPublicType *publicType_local;
  TSourceLoc *loc_local;
  TParseContext *this_local;
  
  if (((this->super_TParseContextBase).parsingBuiltins & 1U) != 0) {
    return;
  }
  bVar2 = TPublicType::isCoopmatKHR(publicType);
  if (bVar2) {
    if (publicType->typeParameters == (TTypeParameters *)0x0) {
      (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                (this,loc,"coopmat missing type parameters","");
      return;
    }
    TVar1 = publicType->typeParameters->basicType;
    if (((TVar1 != EbtFloat) && (6 < TVar1 - EbtFloat16)) && (TVar1 != EbtSpirvType)) {
      pcVar4 = TType::getBasicString(publicType->typeParameters->basicType);
      (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                (this,loc,"coopmat invalid basic type",pcVar4,"");
    }
    iVar3 = TArraySizes::getNumDims(publicType->typeParameters->arraySizes);
    if (iVar3 != 4) {
      (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                (this,loc,"coopmat incorrect number of type parameters","");
      return;
    }
    iVar3 = TArraySizes::getDimSize(publicType->typeParameters->arraySizes,3);
    if ((iVar3 < 0) || (2 < iVar3)) {
      (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                (this,loc,"coopmat invalid matrix Use","");
      return;
    }
  }
  bVar2 = TPublicType::isTensorLayoutNV(publicType);
  if (bVar2) {
    if (publicType->typeParameters == (TTypeParameters *)0x0) {
      (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                (this,loc,"tensorLayout missing type parameters","");
      return;
    }
    iVar3 = TArraySizes::getNumDims(publicType->typeParameters->arraySizes);
    if (2 < iVar3) {
      (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                (this,loc,"tensorLayout incorrect number of type parameters","");
      return;
    }
    if ((publicType->typeParameters != (TTypeParameters *)0x0) &&
       (iVar3 = TArraySizes::getNumDims(publicType->typeParameters->arraySizes), iVar3 < 2)) {
      while (iVar3 = TArraySizes::getNumDims(publicType->typeParameters->arraySizes), iVar3 < 2) {
        TArraySizes::addInnerSize(publicType->typeParameters->arraySizes,0);
      }
    }
  }
  bVar2 = TPublicType::isTensorViewNV(publicType);
  if (bVar2) {
    if (publicType->typeParameters == (TTypeParameters *)0x0) {
      (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                (this,loc,"tensorView missing type parameters","");
    }
    else {
      iVar3 = TArraySizes::getNumDims(publicType->typeParameters->arraySizes);
      if ((iVar3 < 1) ||
         (iVar3 = TArraySizes::getNumDims(publicType->typeParameters->arraySizes), 7 < iVar3)) {
        (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                  (this,loc,"tensorView incorrect number of type parameters","");
      }
      else if ((publicType->typeParameters != (TTypeParameters *)0x0) &&
              (iVar3 = TArraySizes::getNumDims(publicType->typeParameters->arraySizes), iVar3 < 7))
      {
        for (local_28 = TArraySizes::getNumDims(publicType->typeParameters->arraySizes);
            local_28 < 7; local_28 = local_28 + 1) {
          if (local_28 == 1) {
            local_4c = 0;
          }
          else {
            local_4c = local_28 - 2;
          }
          TArraySizes::addInnerSize(publicType->typeParameters->arraySizes,local_4c);
        }
      }
    }
  }
  return;
}

Assistant:

void TParseContext::typeParametersCheck(const TSourceLoc& loc, const TPublicType& publicType)
{
    if (parsingBuiltins)
        return;
    if (publicType.isCoopmatKHR()) {
        if (publicType.typeParameters == nullptr) {
            error(loc, "coopmat missing type parameters", "", "");
            return;
        }
        switch (publicType.typeParameters->basicType) {
        case EbtFloat:
        case EbtFloat16:
        case EbtInt:
        case EbtInt8:
        case EbtInt16:
        case EbtUint:
        case EbtUint8:
        case EbtUint16:
        case EbtSpirvType:
            break;
        default:
            error(loc, "coopmat invalid basic type", TType::getBasicString(publicType.typeParameters->basicType), "");
            break;
        }
        if (publicType.typeParameters->arraySizes->getNumDims() != 4) {
            error(loc, "coopmat incorrect number of type parameters", "", "");
            return;
        }
        int use = publicType.typeParameters->arraySizes->getDimSize(3);
        if (use < 0 || use > 2) {
            error(loc, "coopmat invalid matrix Use", "", "");
            return;
        }
    }
    if (publicType.isTensorLayoutNV()) {
        if (publicType.typeParameters == nullptr) {
            error(loc, "tensorLayout missing type parameters", "", "");
            return;
        }
        if (publicType.typeParameters->arraySizes->getNumDims() > 2) {
            error(loc, "tensorLayout incorrect number of type parameters", "", "");
            return;
        }
        if (publicType.typeParameters && publicType.typeParameters->arraySizes->getNumDims() < 2) {
            while (publicType.typeParameters->arraySizes->getNumDims() < 2) {
                publicType.typeParameters->arraySizes->addInnerSize(0);
            }
        }
    }
    if (publicType.isTensorViewNV()) {
        if (publicType.typeParameters == nullptr) {
            error(loc, "tensorView missing type parameters", "", "");
            return;
        }
        if (publicType.typeParameters->arraySizes->getNumDims() < 1 ||
            publicType.typeParameters->arraySizes->getNumDims() > 7) {
            error(loc, "tensorView incorrect number of type parameters", "", "");
            return;
        }
        if (publicType.typeParameters && publicType.typeParameters->arraySizes->getNumDims() < 7) {
            uint32_t numDims = publicType.typeParameters->arraySizes->getNumDims();
            while (numDims < 7) {
                uint32_t dim = (numDims == 1) ? 0 : (numDims - 2);
                publicType.typeParameters->arraySizes->addInnerSize(dim);
                numDims++;
            }
        }
    }
}